

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O1

GLvoid __thiscall
glcts::anon_unknown_0::GatherBase::CreateTexture2D(GatherBase *this,bool base_level)

{
  CallLogWrapper *pCVar1;
  int iVar2;
  GLenum format;
  undefined4 extraout_var;
  int i;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint level;
  undefined7 in_register_00000031;
  GLenum type;
  bool bVar6;
  allocator_type local_9d;
  uint local_9c;
  CallLogWrapper *local_98;
  undefined8 local_90;
  Vec4 data [4];
  value_type local_40;
  
  iVar2 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])();
  local_90 = CONCAT44(extraout_var,iVar2);
  format = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x22])(this);
  local_9c = (uint)CONCAT71(in_register_00000031,base_level);
  iVar4 = local_9c * 0x20;
  iVar2 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])(this);
  type = (uint)(iVar2 != 0x8c43) * 5 + 0x1401;
  pCVar1 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(pCVar1,1,&this->tex);
  local_98 = pCVar1;
  glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,this->tex);
  iVar2 = 0;
  uVar5 = iVar4 + 0x20;
  do {
    lVar3 = 0;
    do {
      local_40.m_data[lVar3] = 1.0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)data,
               (ulong)(uVar5 * uVar5),&local_40,&local_9d);
    glu::CallLogWrapper::glTexImage2D
              (local_98,0xde1,iVar2,(GLint)local_90,uVar5,uVar5,0,format,type,
               (void *)data[0].m_data._0_8_);
    if (data[0].m_data._0_8_ != 0) {
      operator_delete((void *)data[0].m_data._0_8_,data[1].m_data._0_8_ - data[0].m_data._0_8_);
    }
    pCVar1 = local_98;
    iVar2 = iVar2 + 1;
    bVar6 = 1 < uVar5;
    uVar5 = uVar5 >> 1;
  } while (bVar6);
  data[0].m_data[0] = 0.75;
  data[0].m_data[1] = 0.8125;
  data[0].m_data[2] = 0.875;
  data[0].m_data[3] = 0.9375;
  data[1].m_data[0] = 0.5;
  data[1].m_data[1] = 0.5625;
  data[1].m_data[2] = 0.625;
  data[1].m_data[3] = 0.6875;
  data[2].m_data[0] = 0.0;
  data[2].m_data[1] = 0.0625;
  data[2].m_data[2] = 0.125;
  data[2].m_data[3] = 0.1875;
  data[3].m_data[0] = 0.25;
  data[3].m_data[1] = 0.3125;
  data[3].m_data[2] = 0.375;
  data[3].m_data[3] = 0.4375;
  uVar5 = local_9c & 0xff;
  level = local_9c & 0xff;
  glu::CallLogWrapper::glTexSubImage2D(local_98,0xde1,uVar5,0x16,0x19,2,2,format,type,data);
  glu::CallLogWrapper::glTexSubImage2D(pCVar1,0xde1,level,0x10,10,1,1,format,type,data);
  glu::CallLogWrapper::glTexSubImage2D(pCVar1,0xde1,uVar5,0xb,2,1,1,format,type,data + 1);
  glu::CallLogWrapper::glTexSubImage2D(pCVar1,0xde1,uVar5,0x18,0xd,1,1,format,type,data + 2);
  glu::CallLogWrapper::glTexSubImage2D(pCVar1,0xde1,uVar5,9,0xe,1,1,format,type,data + 3);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x8072,0x812f);
  pCVar1 = local_98;
  iVar2 = (int)local_90;
  if (iVar2 < 0x8814) {
    if ((iVar2 != 0x822e) && (iVar2 != 0x8230)) goto LAB_00c04b12;
  }
  else if ((1 < iVar2 - 0x8814U) && (iVar2 != 0x8cac)) goto LAB_00c04b12;
  glu::CallLogWrapper::glTexParameteri(local_98,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2801,0x2700);
LAB_00c04b12:
  if ((char)local_9c != '\0') {
    glu::CallLogWrapper::glTexParameteri(local_98,0xde1,0x813c,1);
  }
  return;
}

Assistant:

virtual GLvoid CreateTexture2D(bool base_level = false)
	{
		GLenum		internal_format = InternalFormat();
		GLenum		format			= Format();
		const GLint csize			= base_level ? 64 : 32;
		GLint		size			= csize;
		GLenum		target			= GL_TEXTURE_2D;
		GLenum		tex_type		= InternalFormat() == GL_SRGB8_ALPHA8 ? GL_UNSIGNED_BYTE : GL_FLOAT;

		glGenTextures(1, &tex);
		glBindTexture(target, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			std::vector<Vec4> pixels(size * size, Vec4(1.0));
			glTexImage2D(target, i, internal_format, size, size, 0, format, tex_type, &pixels[0]);
		}

		Vec4 data[4] = { Vec4(12. / 16, 13. / 16, 14. / 16, 15. / 16), Vec4(8. / 16, 9. / 16, 10. / 16, 11. / 16),
						 Vec4(0. / 16, 1. / 16, 2. / 16, 3. / 16), Vec4(4. / 16, 5. / 16, 6. / 16, 7. / 16) };

		glTexSubImage2D(target, base_level, 22, 25, 2, 2, format, tex_type, data);
		glTexSubImage2D(target, base_level, 16, 10, 1, 1, format, tex_type, data + 0);
		glTexSubImage2D(target, base_level, 11, 2, 1, 1, format, tex_type, data + 1);
		glTexSubImage2D(target, base_level, 24, 13, 1, 1, format, tex_type, data + 2);
		glTexSubImage2D(target, base_level, 9, 14, 1, 1, format, tex_type, data + 3);

		glTexParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);

		if (IsFloatingPointTexture(internal_format))
		{
			glTexParameteri(target, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexParameteri(target, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
		}

		if (base_level)
			glTexParameteri(target, GL_TEXTURE_BASE_LEVEL, 1);
	}